

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O1

void masc::polygon::updateHullTop
               (ply_vertex *v,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 extraout_var;
  int i;
  long lVar6;
  _Self __tmp;
  _Self __tmp_1;
  Vector<double,_2> vec;
  double local_48 [5];
  
  while( true ) {
    if ((hull->
        super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>)
        ._M_impl._M_node._M_size == 1) {
      return;
    }
    p_Var2 = (hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
    lVar4 = (*(code *)(p_Var2->_M_prev[1]._M_next)->_M_next[1]._M_next)();
    lVar5 = (*(code *)(p_Var2[1]._M_next)->_M_next[1]._M_next)();
    iVar3 = (*v->_vptr_ply_vertex[2])(v);
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    lVar6 = 0;
    do {
      local_48[lVar6 + 2] = *(double *)(lVar5 + lVar6 * 8) - *(double *)(lVar4 + lVar6 * 8);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    lVar4 = 0;
    do {
      local_48[lVar4] =
           *(double *)(CONCAT44(extraout_var,iVar3) + lVar4 * 8) - *(double *)(lVar5 + lVar4 * 8);
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    if (0.0 < local_48[2] * local_48[1] - local_48[3] * local_48[0]) break;
    p_Var2 = (hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
    psVar1 = &(hull->
              super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
  }
  return;
}

Assistant:

inline void updateHullTop(ply_vertex * v,list<ply_vertex*>& hull)
{
    typedef list<ply_vertex*>::iterator VIT;
    if( hull.size()==1 ) return;
    VIT l1=hull.end(); l1--;
    VIT l2=l1; l2--;
    if( turn_left((*l2)->getPos(),(*l1)->getPos(),v->getPos()) )
        return;
    hull.pop_back();
    updateHullTop(v,hull);
}